

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void test_bhdct_delete_nonexist_single(planck_unit_test_t *tc)

{
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  ion_dictionary_t local_78;
  ion_dictionary_handler_t local_60;
  
  bhdct_setup(tc,&local_60,&local_78,ion_fill_none);
  local_7c = 5;
  local_80 = 10;
  bhdct_insert(tc,&local_78,&local_7c,&local_80,'\x01');
  local_84 = 3;
  bhdct_delete(tc,&local_78,&local_84,'\x01',0,'\x01');
  bhdct_delete_dictionary(tc,&local_78);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_delete_nonexist_single(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_none);

	bhdct_insert(tc, &dict, IONIZE(5, int), IONIZE(10, int), boolean_true);
	bhdct_delete(tc, &dict, IONIZE(3, int), err_item_not_found, 0, boolean_true);

	bhdct_takedown(tc, &dict);
}